

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  byte bVar1;
  Proto *pPVar2;
  global_State *g;
  int iVar3;
  int iVar4;
  TString **ppTVar5;
  ulong uVar6;
  BlockCnt *pBVar7;
  long lVar8;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VGLOBAL;
    (var->u).s.info = 0xff;
    iVar3 = 8;
  }
  else {
    uVar6 = (ulong)fs->nactvar;
    do {
      if ((long)uVar6 < 1) {
        uVar6 = 0xffffffff;
        break;
      }
      lVar8 = uVar6 + 0x3b;
      uVar6 = uVar6 - 1;
    } while (fs->f->locvars[*(ushort *)&fs->upvalues[lVar8].info].varname != n);
    if ((int)uVar6 < 0) {
      iVar4 = singlevaraux(fs->prev,n,var,0);
      iVar3 = 8;
      if (iVar4 != 8) {
        pPVar2 = fs->f;
        iVar3 = pPVar2->sizeupvalues;
        lVar8 = (long)iVar3;
        bVar1 = pPVar2->nups;
        if ((ulong)bVar1 != 0) {
          uVar6 = 0;
          do {
            if ((var->k == (uint)fs->upvalues[uVar6].k) &&
               ((var->u).s.info == (uint)fs->upvalues[uVar6].info)) goto LAB_0010f0c2;
            uVar6 = uVar6 + 1;
          } while (bVar1 != uVar6);
        }
        if (0x3b < bVar1) {
          errorlimit(fs,0x3c,"upvalues");
        }
        if (iVar3 <= (int)(uint)bVar1) {
          ppTVar5 = (TString **)
                    luaM_growaux_(fs->L,pPVar2->upvalues,&pPVar2->sizeupvalues,8,0x7ffffffd,"");
          pPVar2->upvalues = ppTVar5;
        }
        iVar4 = pPVar2->sizeupvalues;
        if (iVar3 < iVar4) {
          do {
            pPVar2->upvalues[lVar8] = (TString *)0x0;
            lVar8 = lVar8 + 1;
          } while (iVar4 != lVar8);
        }
        pPVar2->upvalues[pPVar2->nups] = n;
        if ((((n->tsv).marked & 3) != 0) && ((pPVar2->marked & 4) != 0)) {
          g = fs->L->l_G;
          if (g->gcstate == '\x01') {
            reallymarkobject(g,(GCObject *)n);
          }
          else {
            pPVar2->marked = g->currentwhite & 3 | pPVar2->marked & 0xf8;
          }
        }
        bVar1 = pPVar2->nups;
        uVar6 = (ulong)bVar1;
        fs->upvalues[uVar6].k = (char)var->k;
        fs->upvalues[uVar6].info = *(lu_byte *)&var->u;
        pPVar2->nups = bVar1 + 1;
LAB_0010f0c2:
        (var->u).s.info = (int)uVar6;
        var->k = VUPVAL;
        iVar3 = 7;
      }
    }
    else {
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).s.info = (int)uVar6;
      iVar3 = 6;
      if (base == 0) {
        pBVar7 = (BlockCnt *)&fs->bl;
        do {
          pBVar7 = pBVar7->previous;
          if (pBVar7 == (BlockCnt *)0x0) {
            return 6;
          }
        } while ((byte)uVar6 < pBVar7->nactvar);
        pBVar7->upval = '\x01';
      }
    }
  }
  return iVar3;
}

Assistant:

static int singlevaraux(FuncState*fs,TString*n,expdesc*var,int base){
if(fs==NULL){
init_exp(var,VGLOBAL,((1<<8)-1));
return VGLOBAL;
}
else{
int v=searchvar(fs,n);
if(v>=0){
init_exp(var,VLOCAL,v);
if(!base)
markupval(fs,v);
return VLOCAL;
}
else{
if(singlevaraux(fs->prev,n,var,0)==VGLOBAL)
return VGLOBAL;
var->u.s.info=indexupvalue(fs,n,var);
var->k=VUPVAL;
return VUPVAL;
}
}
}